

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O3

bool __thiscall Json::StyledWriter::isMultineArray(StyledWriter *this,Value *value)

{
  bool bVar1;
  ArrayIndex AVar2;
  ArrayIndex AVar3;
  Value *pVVar4;
  uint uVar5;
  StyledWriter *this_00;
  byte bVar6;
  long lVar7;
  ulong uVar8;
  bool bVar9;
  
  AVar2 = Value::size(value);
  bVar9 = this->rightMargin_ <= AVar2 * 3;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end(&this->childValues_,
                    (this->childValues_).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  if (AVar2 != 0 && !bVar9) {
    uVar5 = 1;
    do {
      pVVar4 = Value::operator[](value,uVar5 - 1);
      bVar9 = Value::isArray(pVVar4);
      if ((bVar9) || (bVar9 = Value::isObject(pVVar4), bVar9)) {
        AVar3 = Value::size(pVVar4);
        bVar9 = AVar3 != 0;
      }
      else {
        bVar9 = false;
      }
    } while ((uVar5 < AVar2) && (uVar5 = uVar5 + 1, !bVar9));
  }
  bVar1 = true;
  if (!bVar9) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->childValues_,(ulong)AVar2);
    this->addChildValues_ = true;
    uVar5 = AVar2 * 2 + 2;
    if (AVar2 == 0) {
      bVar6 = 0;
    }
    else {
      lVar7 = 8;
      uVar8 = 0;
      bVar6 = 0;
      do {
        this_00 = (StyledWriter *)value;
        pVVar4 = Value::operator[](value,(ArrayIndex)uVar8);
        bVar9 = hasCommentForValue(this_00,pVVar4);
        bVar6 = bVar6 | bVar9;
        pVVar4 = Value::operator[](value,(ArrayIndex)uVar8);
        writeValue(this,pVVar4);
        uVar5 = uVar5 + *(int *)((long)&(((this->childValues_).
                                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                        _M_p + lVar7);
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x20;
      } while (AVar2 != uVar8);
    }
    this->addChildValues_ = false;
    bVar1 = (bool)(this->rightMargin_ <= uVar5 | bVar6);
  }
  return bVar1;
}

Assistant:

bool StyledWriter::isMultineArray(const Value& value) {
  ArrayIndex const size = value.size();
  bool isMultiLine = size * 3 >= rightMargin_;
  childValues_.clear();
  for (ArrayIndex index = 0; index < size && !isMultiLine; ++index) {
    const Value& childValue = value[index];
    isMultiLine = ((childValue.isArray() || childValue.isObject()) &&
                        childValue.size() > 0);
  }
  if (!isMultiLine) // check if line length > max line length
  {
    childValues_.reserve(size);
    addChildValues_ = true;
    ArrayIndex lineLength = 4 + (size - 1) * 2; // '[ ' + ', '*n + ' ]'
    for (ArrayIndex index = 0; index < size; ++index) {
      if (hasCommentForValue(value[index])) {
        isMultiLine = true;
      }
      writeValue(value[index]);
      lineLength += static_cast<ArrayIndex>(childValues_[index].length());
    }
    addChildValues_ = false;
    isMultiLine = isMultiLine || lineLength >= rightMargin_;
  }
  return isMultiLine;
}